

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::update_gl_camera(Application *this)

{
  long *in_RDI;
  Vector3D *u;
  Vector3D *r;
  Vector3D *c;
  GLint view [4];
  Camera *in_stack_ffffffffffffff78;
  Camera *in_stack_ffffffffffffff88;
  undefined8 local_70;
  undefined8 local_58 [3];
  undefined8 *local_40;
  undefined8 local_38 [3];
  undefined8 *local_20;
  undefined1 local_18 [8];
  int local_10;
  int local_c;
  
  glGetIntegerv(0xba2,local_18);
  if (((long)local_10 != in_RDI[0x44]) || ((long)local_c != in_RDI[0x45])) {
    (**(code **)(*in_RDI + 0x20))(in_RDI,(long)local_10,(long)local_c);
  }
  glMatrixMode(0x1700);
  glLoadIdentity();
  Camera::position(in_stack_ffffffffffffff78);
  local_20 = local_38;
  Camera::view_point(in_stack_ffffffffffffff78);
  local_40 = local_58;
  Camera::up_dir(in_stack_ffffffffffffff88);
  gluLookAt(*local_20,local_20[1],local_20[2],*local_40,local_40[1],local_40[2],
            in_stack_ffffffffffffff88,local_70);
  return;
}

Assistant:

void Application::update_gl_camera() {
  // Call resize() every time we draw, since it doesn't seem
  // to get called by the Viewer upon initial window creation
  // (this should probably be fixed!).
  GLint view[4];
  glGetIntegerv(GL_VIEWPORT, view);
  if (view[2] != screenW || view[3] != screenH) {
    resize(view[2], view[3]);
  }

  // Control the camera to look at the mesh.
  glMatrixMode(GL_MODELVIEW);
  glLoadIdentity();

  const Vector3D &c = camera.position();
  const Vector3D &r = camera.view_point();
  const Vector3D &u = camera.up_dir();

  gluLookAt(c.x, c.y, c.z, r.x, r.y, r.z, u.x, u.y, u.z);
}